

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_39db::TlbExportVisitor::visit_
          (TlbExportVisitor *this,Compound *type,Field *field)

{
  ostream *poVar1;
  ulong uVar2;
  TlbExportVisitor local_b0 [32];
  string local_90 [32];
  anon_unknown_dwarf_39db local_70 [48];
  string local_40 [32];
  Field *local_20;
  Field *field_local;
  Compound *type_local;
  TlbExportVisitor *this_local;
  
  local_20 = field;
  field_local = (Field *)type;
  type_local = (Compound *)this;
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  poVar1 = std::operator<<(poVar1,"<field name=\"");
  Typelib::Field::getName_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,local_40);
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1," type=\"");
  Typelib::Field::getType();
  Typelib::Type::getName_abi_cxx11_();
  xmlEscape(local_70,local_90);
  poVar1 = std::operator<<(poVar1,(string *)local_70);
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1," offset=\"");
  uVar2 = Typelib::Field::getOffset();
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  std::operator<<(poVar1,"\">\n");
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string(local_40);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  Typelib::Field::getMetaData();
  (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_(local_b0,(MetaData *)this);
  poVar1 = std::operator<<(poVar1,(string *)local_b0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)local_b0);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  std::operator<<(poVar1,"</field>\n");
  return true;
}

Assistant:

bool TlbExportVisitor::visit_(Compound const& type, Field const& field)
    {
        m_stream
            << m_indent
            << "<field name=\"" << field.getName() << "\""
            << " type=\""   << xmlEscape(field.getType().getName())  << "\""
            << " offset=\"" << field.getOffset() << "\">\n";
        m_stream << m_indent << emitMetaData(field.getMetaData()) << "\n";
        m_stream << m_indent << "</field>\n";
        return true;
    }